

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

BindingAlias *
duckdb::Binding::GetAlias
          (BindingAlias *__return_storage_ptr__,string *explicit_alias,
          optional_ptr<duckdb::StandardEntry,_true> entry)

{
  StandardEntry *entry_00;
  InternalException *this;
  allocator local_61;
  optional_ptr<duckdb::StandardEntry,_true> entry_local;
  string local_58;
  string local_38;
  
  entry_local = entry;
  if (explicit_alias->_M_string_length == 0) {
    if (entry.ptr == (StandardEntry *)0x0) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,
                 "Binding::GetAlias called - but neither an alias nor an entry was provided",
                 &local_61);
      InternalException::InternalException(this,&local_58);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    entry_00 = optional_ptr<duckdb::StandardEntry,_true>::operator*(&entry_local);
    BindingAlias::BindingAlias(__return_storage_ptr__,entry_00);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_38,(string *)explicit_alias);
    BindingAlias::BindingAlias(__return_storage_ptr__,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

BindingAlias Binding::GetAlias(const string &explicit_alias, optional_ptr<StandardEntry> entry) {
	if (!explicit_alias.empty()) {
		return BindingAlias(explicit_alias);
	}
	if (!entry) {
		throw InternalException("Binding::GetAlias called - but neither an alias nor an entry was provided");
	}
	// no explicit alias provided - generate from entry
	return BindingAlias(*entry);
}